

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderIncompleteProgramObjectsTest::initTestRuns
          (GeometryShaderIncompleteProgramObjectsTest *this)

{
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  *this_00;
  _run local_2c;
  _run local_29;
  _run local_26;
  _run local_23;
  
  this_00 = &this->m_test_runs;
  local_23.use_fs = false;
  local_23.use_gs = true;
  local_23.use_separable_po = false;
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>(this_00,&local_23);
  local_26.use_fs = false;
  local_26.use_gs = true;
  local_26.use_separable_po = true;
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>(this_00,&local_26);
  local_29.use_fs = true;
  local_29.use_gs = true;
  local_29.use_separable_po = false;
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>(this_00,&local_29);
  local_2c.use_fs = true;
  local_2c.use_gs = true;
  local_2c.use_separable_po = true;
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>(this_00,&local_2c);
  return;
}

Assistant:

void GeometryShaderIncompleteProgramObjectsTest::initTestRuns()
{
	/*                         use_fs| use_gs| use_separable_po
	 *                         ------|-------|-----------------*/
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(false, true, true));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(true, true, true));
}